

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

void __thiscall
leveldb::TableCache::TableCache(TableCache *this,string *dbname,Options *options,int entries)

{
  pointer pcVar1;
  Cache *pCVar2;
  
  this->env_ = options->env;
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  pcVar1 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dbname_,pcVar1,pcVar1 + dbname->_M_string_length);
  this->options_ = options;
  pCVar2 = NewLRUCache((long)entries);
  this->cache_ = pCVar2;
  return;
}

Assistant:

TableCache::TableCache(const std::string& dbname, const Options& options,
                       int entries)
    : env_(options.env),
      dbname_(dbname),
      options_(options),
      cache_(NewLRUCache(entries)) {}